

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O1

APInt * __thiscall llvm::APInt::operator--(APInt *this)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint uVar3;
  uint64_t *puVar4;
  APInt *pAVar5;
  ulong uVar6;
  
  uVar3 = this->BitWidth;
  if ((ulong)uVar3 < 0x41) {
    (this->U).pVal = (uint64_t *)((this->U).VAL - 1);
    pAVar5 = clearUnusedBits(this);
    return pAVar5;
  }
  puVar4 = (this->U).pVal;
  uVar2 = *puVar4;
  *puVar4 = *puVar4 - 1;
  if (uVar2 == 0) {
    uVar6 = 1;
    do {
      if ((ulong)uVar3 + 0x3f >> 6 == uVar6) break;
      puVar1 = puVar4 + uVar6;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 - 1;
      uVar6 = uVar6 + 1;
    } while (uVar2 == 0);
  }
  pAVar5 = this;
  uVar3 = this->BitWidth;
  if (0x40 < (ulong)uVar3) {
    this = (APInt *)((this->U).pVal + ((int)((ulong)uVar3 + 0x3f >> 6) - 1));
  }
  (this->U).VAL = ((this->U).VAL << (-(char)uVar3 & 0x3fU)) >> (-(char)uVar3 & 0x3fU);
  return pAVar5;
}

Assistant:

bool isSingleWord() const { return BitWidth <= APINT_BITS_PER_WORD; }